

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWRepository.cxx
# Opt level: O0

void __thiscall
cmCPackIFWRepository::WriteRepositoryUpdates(cmCPackIFWRepository *this,cmXMLWriter *xout)

{
  cmXMLWriter *this_00;
  bool bVar1;
  reference ppcVar2;
  __normal_iterator<cmCPackIFWRepository_**,_std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>_>
  local_60;
  __normal_iterator<cmCPackIFWRepository_**,_std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>_>
  local_58;
  iterator rit;
  allocator local_39;
  string local_38;
  cmXMLWriter *local_18;
  cmXMLWriter *xout_local;
  cmCPackIFWRepository *this_local;
  
  local_18 = xout;
  xout_local = (cmXMLWriter *)this;
  bVar1 = std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>::empty
                    (&this->RepositoryUpdate);
  this_00 = local_18;
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"RepositoryUpdate",&local_39);
    cmXMLWriter::StartElement(this_00,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    local_58._M_current =
         (cmCPackIFWRepository **)
         std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>::begin
                   (&this->RepositoryUpdate);
    while( true ) {
      local_60._M_current =
           (cmCPackIFWRepository **)
           std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>::end
                     (&this->RepositoryUpdate);
      bVar1 = __gnu_cxx::operator!=(&local_58,&local_60);
      if (!bVar1) break;
      ppcVar2 = __gnu_cxx::
                __normal_iterator<cmCPackIFWRepository_**,_std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>_>
                ::operator*(&local_58);
      WriteRepositoryUpdate(*ppcVar2,local_18);
      __gnu_cxx::
      __normal_iterator<cmCPackIFWRepository_**,_std::vector<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>_>
      ::operator++(&local_58);
    }
    cmXMLWriter::EndElement(local_18);
  }
  return;
}

Assistant:

void cmCPackIFWRepository::WriteRepositoryUpdates(cmXMLWriter& xout)
{
  if (!this->RepositoryUpdate.empty()) {
    xout.StartElement("RepositoryUpdate");
    for (RepositoriesVector::iterator rit = this->RepositoryUpdate.begin();
         rit != this->RepositoryUpdate.end(); ++rit) {
      (*rit)->WriteRepositoryUpdate(xout);
    }
    xout.EndElement();
  }
}